

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DefParamSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::DefParamSyntax,slang::syntax::DefParamSyntax_const&>
          (BumpAllocator *this,DefParamSyntax *args)

{
  DefParamSyntax *pDVar1;
  DefParamSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pDVar1 = (DefParamSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::DefParamSyntax::DefParamSyntax(in_RSI,pDVar1);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }